

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Liby::Buffer::shrink_to_fit(Buffer *this,off_t len)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  size_t __n;
  
  lVar1 = this->leftIndex_;
  __n = this->rightIndex_ - lVar1;
  if (this->rightIndex_ < lVar1) {
    __assert_fail("rightIndex_ >= leftIndex_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                  ,0x5a,"off_t Liby::Buffer::size() const");
  }
  if (len < (long)__n) {
    shrink(this,__n);
    return;
  }
  if (len < this->capacity_ - lVar1) {
    uVar5 = lVar1 + len;
    uVar4 = 0xffffffffffffffff;
    if (-1 < (long)uVar5) {
      uVar4 = uVar5;
    }
    pcVar3 = (char *)operator_new__(uVar4);
    pcVar2 = this->buffer_;
    memcpy(pcVar3 + lVar1,pcVar2 + lVar1,__n);
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
      uVar5 = len + this->leftIndex_;
    }
    this->buffer_ = pcVar3;
    this->capacity_ = uVar5;
  }
  return;
}

Assistant:

off_t Buffer::size() const {
    assert(rightIndex_ >= leftIndex_);
    return rightIndex_ - leftIndex_;
}